

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_887c0::CpuAbsoluteTest::~CpuAbsoluteTest(CpuAbsoluteTest *this)

{
  code *pcVar1;
  CpuAbsoluteTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void run_read_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const auto lower_address = static_cast<uint8_t>(
                effective_address & static_cast<uint16_t>(0x00FFu));
        const auto upper_address = static_cast<uint8_t>(
                static_cast<uint16_t>(effective_address & 0xFF00u) >> 8u);

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(lower_address));
        EXPECT_CALL(mmu, read_byte(start_pc + 2))
                .WillOnce(Return(upper_address));
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));

        step_execution(4);
        EXPECT_EQ(expected, registers);
    }